

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O3

void lyd_free_leafref_nodes(lyd_node_term *node)

{
  lysc_node *plVar1;
  ly_ht *ht;
  LY_ERR LVar2;
  uint32_t hash;
  lys_module *plVar3;
  lyd_node_term *in_RDI;
  lyd_leafref_links_rec *rec;
  lyd_leafref_links_rec *local_18;
  char local_10 [8];
  
  if (in_RDI != (lyd_node_term *)0x0) {
    LVar2 = lyd_get_or_create_leafref_links_record(in_RDI,&local_18,'\0');
    if (LVar2 == LY_SUCCESS) {
      lyd_free_leafref_links_rec(local_18);
      plVar1 = (in_RDI->field_0).node.schema;
      if (plVar1 == (lysc_node *)0x0) {
        plVar3 = (lys_module *)&in_RDI[1].field_0.node.next;
      }
      else {
        plVar3 = plVar1->module;
      }
      ht = plVar3->ctx->leafref_links_ht;
      hash = lyht_hash(local_10,8);
      lyht_remove(ht,local_18,hash);
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_free.c"
                ,0xb6,"void lyd_free_leafref_nodes(const struct lyd_node_term *)");
}

Assistant:

void
lyd_free_leafref_nodes(const struct lyd_node_term *node)
{
    struct ly_ht *ht;
    uint32_t hash;
    struct lyd_leafref_links_rec *rec;

    assert(node);

    if (lyd_get_or_create_leafref_links_record(node, &rec, 0)) {
        return;
    }

    /* free entry content */
    lyd_free_leafref_links_rec(rec);

    /* free entry itself from hash table */
    ht = LYD_CTX(node)->leafref_links_ht;
    hash = lyht_hash((const char *)&node, sizeof node);
    lyht_remove(ht, rec, hash);
}